

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O3

TimeZone * __thiscall icu_63::ChineseCalendar::getChineseCalZoneAstroCalc(ChineseCalendar *this)

{
  UBool UVar1;
  SimpleTimeZone *this_00;
  size_t in_RSI;
  ConstChar16Ptr local_68;
  char16_t *local_60;
  UnicodeString local_50;
  
  if (gChineseCalendarZoneAstroCalcInitOnce.fState.super___atomic_base<int>._M_i != 2) {
    UVar1 = umtx_initImplPreInit(&gChineseCalendarZoneAstroCalcInitOnce);
    if (UVar1 != '\0') {
      this_00 = (SimpleTimeZone *)UMemory::operator_new((UMemory *)0xa0,in_RSI);
      if (this_00 == (SimpleTimeZone *)0x0) {
        gChineseCalendarZoneAstroCalc = (TimeZone *)0x0;
      }
      else {
        local_68.p_ = L"CHINA_ZONE";
        UnicodeString::UnicodeString(&local_50,'\x01',&local_68,-1);
        SimpleTimeZone::SimpleTimeZone(this_00,28800000,&local_50);
        gChineseCalendarZoneAstroCalc = (TimeZone *)this_00;
        UnicodeString::~UnicodeString(&local_50);
        local_60 = local_68.p_;
      }
      ucln_i18n_registerCleanup_63(UCLN_I18N_CHINESE_CALENDAR,calendar_chinese_cleanup);
      umtx_initImplPostInit(&gChineseCalendarZoneAstroCalcInitOnce);
    }
  }
  return gChineseCalendarZoneAstroCalc;
}

Assistant:

double ChineseCalendar::daysToMillis(double days) const {
    double millis = days * (double)kOneDay;
    if (fZoneAstroCalc != NULL) {
        int32_t rawOffset, dstOffset;
        UErrorCode status = U_ZERO_ERROR;
        fZoneAstroCalc->getOffset(millis, FALSE, rawOffset, dstOffset, status);
        if (U_SUCCESS(status)) {
        	return millis - (double)(rawOffset + dstOffset);
        }
    }
    return millis - (double)CHINA_OFFSET;
}